

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comServer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long *plVar1;
  IFooService *pIVar2;
  IFoo *pIVar3;
  ComId local_98;
  CreateInstanceHelper local_90;
  SmartPtr<IFoo> local_70;
  SmartPtr<IFoo> foo;
  ComId local_58;
  GetServiceHelper local_50;
  SmartPtr<IFooService> local_30;
  SmartPtr<IFooService> service;
  ErrorCode result;
  IComponentManager *mgr;
  char **argv_local;
  int argc_local;
  
  plVar1 = (long *)JHCOM::getComponentManager();
  service.mObj._4_4_ = (**(code **)(*plVar1 + 0x28))(plVar1,"libfooservice.so");
  if (service.mObj._4_4_ == 0) {
    JHCOM::ComId::ComId(&local_58,"FooService");
    JHCOM::doGetService(&local_50,&local_58,(ErrorCode *)((long)&service.mObj + 4));
    SmartPtr<IFooService>::SmartPtr(&local_30,&local_50.super_SmartPtrHelper);
    JHCOM::GetServiceHelper::~GetServiceHelper(&local_50);
    if (service.mObj._4_4_ == 0) {
      pIVar2 = SmartPtr<IFooService>::operator->(&local_30);
      (**(code **)(*(long *)pIVar2 + 0x28))();
    }
    else {
      jh_log_print(2,"int main(int, char **)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                   ,0x37,"Failed to get service %d",service.mObj._4_4_);
    }
    JHCOM::ComId::ComId(&local_98,"FooFactory");
    JHCOM::doCreateInstance(&local_90,&local_98,(ErrorCode *)((long)&service.mObj + 4));
    SmartPtr<IFoo>::SmartPtr(&local_70,&local_90.super_SmartPtrHelper);
    JHCOM::CreateInstanceHelper::~CreateInstanceHelper(&local_90);
    if (service.mObj._4_4_ == 0) {
      pIVar3 = SmartPtr<IFoo>::operator->(&local_70);
      (**(code **)(*(long *)pIVar3 + 0x28))();
    }
    else {
      jh_log_print(2,"int main(int, char **)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                   ,0x3e,"Failed to get service %d",service.mObj._4_4_);
    }
    SmartPtr<IFoo>::~SmartPtr(&local_70);
    SmartPtr<IFooService>::~SmartPtr(&local_30);
  }
  else {
    jh_log_print(2,"int main(int, char **)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                 ,0x2e,"Failed to fail library %d",service.mObj._4_4_);
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
	IComponentManager *mgr = getComponentManager();
	ErrorCode result;
	
	result = mgr->LoadLibrary( "libfooservice.so" );

	if ( result != kNoError )
	{
		LOG_WARN( "Failed to fail library %d", result );
		return 0;
	}
	
	SmartPtr<IFooService> service = doGetService( "FooService", &result );
	
	if ( result == kNoError )
		service->Run();
	else
		LOG_WARN( "Failed to get service %d", result );
	
	SmartPtr<IFoo> foo = doCreateInstance( "FooFactory", &result );
	
	if ( result == kNoError )
		foo->Run();
	else
		LOG_WARN( "Failed to get service %d", result );
		
	return 0;
}